

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::UdpDeclarationSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,UdpDeclarationSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (UdpDeclarationSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (UdpDeclarationSyntax *)0x1:
    return __return_storage_ptr__ + 5;
  case (UdpDeclarationSyntax *)0x2:
    return __return_storage_ptr__ + 6;
  case (UdpDeclarationSyntax *)0x3:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[7].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (UdpDeclarationSyntax *)0x4:
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[7].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  case (UdpDeclarationSyntax *)0x5:
    return __return_storage_ptr__ + 8;
  case (UdpDeclarationSyntax *)0x6:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[9].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax UdpDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &primitive;
        case 2: return &name;
        case 3: return portList.get();
        case 4: return body.get();
        case 5: return &endprimitive;
        case 6: return endBlockName;
        default: return nullptr;
    }
}